

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int emit_break(JSParseState *s,JSAtom name,int is_cont)

{
  int in_EDX;
  int in_ESI;
  JSParseState *in_RDI;
  int scope_level;
  int i;
  BlockEnv *top;
  int scope_stop;
  int in_stack_ffffffffffffffdc;
  JSContext *s_00;
  uint8_t val;
  int local_4;
  
  scope_stop = in_RDI->cur_func->scope_level;
  s_00 = (JSContext *)in_RDI->cur_func->top_break;
  while( true ) {
    if (s_00 == (JSContext *)0x0) {
      if (in_ESI == 0) {
        if (in_EDX == 0) {
          local_4 = js_parse_error(in_RDI,"break must be inside loop or switch");
        }
        else {
          local_4 = js_parse_error(in_RDI,"continue must be inside loop");
        }
      }
      else {
        local_4 = js_parse_error(in_RDI,"break/continue label not found");
      }
      return local_4;
    }
    close_scopes((JSParseState *)s_00,in_stack_ffffffffffffffdc,scope_stop);
    scope_stop = (((JSParseState *)s_00)->token).line_num;
    if (((in_EDX != 0) && (*(int *)&((JSParseState *)s_00)->filename != -1)) &&
       ((in_ESI == 0 || (((JSParseState *)s_00)->last_line_num == in_ESI)))) break;
    if (((in_EDX == 0) && (((JSParseState *)s_00)->line_num != -1)) &&
       ((in_ESI == 0 || (((JSParseState *)s_00)->last_line_num == in_ESI)))) {
      emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffffdc,scope_stop),0,0x19e42d);
      return 0;
    }
    in_stack_ffffffffffffffdc = 0;
    if (*(int *)&(((JSParseState *)s_00)->token).ptr != 0) {
      emit_op(in_RDI,(uint8_t)((uint)in_ESI >> 0x18));
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 3;
    }
    for (; val = (uint8_t)((uint)in_ESI >> 0x18),
        in_stack_ffffffffffffffdc < *(int *)((long)&((JSParseState *)s_00)->filename + 4);
        in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
      emit_op(in_RDI,val);
    }
    if ((((JSParseState *)s_00)->token).val != -1) {
      emit_op(in_RDI,val);
      emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffffdc,scope_stop),0,0x19e4c4);
      emit_op(in_RDI,(uint8_t)((uint)in_ESI >> 0x18));
    }
    s_00 = ((JSParseState *)s_00)->ctx;
  }
  emit_goto((JSParseState *)CONCAT44(in_stack_ffffffffffffffdc,scope_stop),0,0x19e3e2);
  return 0;
}

Assistant:

static __exception int emit_break(JSParseState *s, JSAtom name, int is_cont)
{
    BlockEnv *top;
    int i, scope_level;

    scope_level = s->cur_func->scope_level;
    top = s->cur_func->top_break;
    while (top != NULL) {
        close_scopes(s, scope_level, top->scope_level);
        scope_level = top->scope_level;
        if (is_cont &&
            top->label_cont != -1 &&
            (name == JS_ATOM_NULL || top->label_name == name)) {
            /* continue stays inside the same block */
            emit_goto(s, OP_goto, top->label_cont);
            return 0;
        }
        if (!is_cont &&
            top->label_break != -1 &&
            (name == JS_ATOM_NULL || top->label_name == name)) {
            emit_goto(s, OP_goto, top->label_break);
            return 0;
        }
        i = 0;
        if (top->has_iterator) {
            emit_op(s, OP_iterator_close);
            i += 3;
        }
        for(; i < top->drop_count; i++)
            emit_op(s, OP_drop);
        if (top->label_finally != -1) {
            /* must push dummy value to keep same stack depth */
            emit_op(s, OP_undefined);
            emit_goto(s, OP_gosub, top->label_finally);
            emit_op(s, OP_drop);
        }
        top = top->prev;
    }
    if (name == JS_ATOM_NULL) {
        if (is_cont)
            return js_parse_error(s, "continue must be inside loop");
        else
            return js_parse_error(s, "break must be inside loop or switch");
    } else {
        return js_parse_error(s, "break/continue label not found");
    }
}